

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

string * __thiscall
duckdb::Exception::ConstructMessage<std::__cxx11::string,duckdb::PhysicalType>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          PhysicalType params_1)

{
  pointer *ppEVar1;
  pointer pcVar2;
  undefined7 in_register_00000081;
  PhysicalType in_R9B;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  undefined1 local_58 [24];
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> local_40;
  
  local_58._0_8_ = (pointer)0x0;
  local_58._8_8_ = (pointer)0x0;
  local_58._16_8_ = 0;
  ppEVar1 = &local_40.
             super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pcVar2 = (msg->_M_dataplus)._M_p;
  local_40.
  super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)ppEVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + msg->_M_string_length,params,
             CONCAT71(in_register_00000081,params_1));
  ConstructMessageRecursive<std::__cxx11::string,duckdb::PhysicalType>
            (__return_storage_ptr__,this,(string *)local_58,&local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)params & 0xff),in_R9B);
  if (local_40.
      super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppEVar1) {
    operator_delete(local_40.
                    super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  ~vector((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
          local_58);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}